

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall S2Builder::EdgeChainSimplifier::Run(EdgeChainSimplifier *this)

{
  pointer *pppVar1;
  ulong *puVar2;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  vector<int,std::allocator<int>> *this_01;
  int iVar3;
  _Bit_type *p_Var4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar5;
  iterator iVar6;
  iterator iVar7;
  bool bVar8;
  pointer ppVar9;
  pair<int,_int> *__args;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  _Bit_type _Var13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int local_48;
  int local_44;
  vector<int,_std::allocator<int>_> *local_40;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_38;
  
  if (0 < this->g_->num_vertices_) {
    uVar14 = 0;
    do {
      bVar8 = IsInterior(this,(VertexId)uVar14);
      p_Var4 = (this->is_interior_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar11 = uVar14 >> 6;
      uVar12 = 1L << ((byte)uVar14 & 0x3f);
      if (bVar8) {
        _Var13 = uVar12 | p_Var4[uVar11];
      }
      else {
        _Var13 = ~uVar12 & p_Var4[uVar11];
      }
      p_Var4[uVar11] = _Var13;
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)this->g_->num_vertices_);
  }
  pvVar5 = this->g_->edges_;
  ppVar9 = (pvVar5->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pvVar5->
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9) >> 3)) {
    local_38 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->new_edges_;
    local_40 = &this->new_input_edge_ids_;
    uVar14 = 0;
    do {
      if (((this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
           ._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
        uVar12 = (ulong)ppVar9[uVar14].first;
        p_Var4 = (this->is_interior_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar11 = uVar12 + 0x3f;
        if (-1 < (long)uVar12) {
          uVar11 = uVar12;
        }
        if ((p_Var4[((long)uVar11 >> 6) +
                    (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
                   ] >> (uVar12 & 0x3f) & 1) == 0) {
          uVar12 = (ulong)ppVar9[uVar14].second;
          uVar11 = uVar12 + 0x3f;
          if (-1 < (long)uVar12) {
            uVar11 = uVar12;
          }
          if ((p_Var4[((long)uVar11 >> 6) +
                      (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff] >> (uVar12 & 0x3f) & 1) == 0) {
            iVar6._M_current =
                 (this->new_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (this->new_edges_).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>const&>(local_38,iVar6,ppVar9 + uVar14);
            }
            else {
              *iVar6._M_current = ppVar9[uVar14];
              pppVar1 = &(this->new_edges_).
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
            local_48 = (this->g_->input_edge_id_set_ids_->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
            iVar7._M_current =
                 (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_40,iVar7,&local_48);
            }
            else {
              *iVar7._M_current = local_48;
              (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            piVar10 = (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar14;
            iVar7._M_current =
                 (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->new_edge_layers_,iVar7,piVar10);
            }
            else {
              *iVar7._M_current = *piVar10;
              (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            puVar2 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar14 >> 6)
            ;
            *puVar2 = *puVar2 | 1L << ((byte)uVar14 & 0x3f);
          }
          else {
            SimplifyChain(this,ppVar9[uVar14].first,ppVar9[uVar14].second);
          }
        }
      }
      uVar14 = uVar14 + 1;
      pvVar5 = this->g_->edges_;
      ppVar9 = (pvVar5->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while ((long)uVar14 <
             (long)(int)((ulong)((long)(pvVar5->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9)
                        >> 3));
  }
  pvVar5 = this->g_->edges_;
  ppVar9 = (pvVar5->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pvVar5->
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9) >> 3)) {
    uVar14 = 0;
    do {
      if (((this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
           ._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
        if (ppVar9[uVar14].first == ppVar9[uVar14].second) {
          iVar6._M_current =
               (this->new_edges_).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->new_edges_).
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>const&>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                       &this->new_edges_,iVar6,ppVar9 + uVar14);
          }
          else {
            *iVar6._M_current = ppVar9[uVar14];
            pppVar1 = &(this->new_edges_).
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          local_44 = (this->g_->input_edge_id_set_ids_->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start[uVar14];
          iVar7._M_current =
               (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&this->new_input_edge_ids_,iVar7,&local_44);
          }
          else {
            *iVar7._M_current = local_44;
            (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar7._M_current + 1;
          }
          piVar10 = (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar14;
          iVar7._M_current =
               (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&this->new_edge_layers_,iVar7,piVar10);
          }
          else {
            *iVar7._M_current = *piVar10;
            (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar7._M_current + 1;
          }
          puVar2 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar14 >> 6);
          *puVar2 = *puVar2 | 1L << ((byte)uVar14 & 0x3f);
        }
        else {
          SimplifyChain(this,ppVar9[uVar14].first,ppVar9[uVar14].second);
        }
      }
      uVar14 = uVar14 + 1;
      pvVar5 = this->g_->edges_;
      ppVar9 = (pvVar5->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while ((long)uVar14 <
             (long)(int)((ulong)((long)(pvVar5->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9)
                        >> 3));
  }
  ppVar9 = (this->new_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->new_edges_).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar9) {
    lVar15 = 0;
    lVar16 = 0;
    uVar14 = 0;
    do {
      iVar3 = *(int *)((long)(this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar16);
      this_00 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                ((this->layer_edges_->
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + iVar3);
      __args = (pair<int,_int> *)((long)&ppVar9->first + lVar15);
      iVar6._M_current = *(pair<int,_int> **)(this_00 + 8);
      if (iVar6._M_current == *(pair<int,_int> **)(this_00 + 0x10)) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>const&>(this_00,iVar6,__args);
      }
      else {
        *iVar6._M_current = *__args;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      this_01 = (vector<int,std::allocator<int>> *)
                ((this->layer_input_edge_ids_->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + iVar3);
      piVar10 = (int *)((long)(this->new_input_edge_ids_).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar16);
      iVar7._M_current = *(int **)(this_01 + 8);
      if (iVar7._M_current == *(int **)(this_01 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this_01,iVar7,piVar10);
      }
      else {
        *iVar7._M_current = *piVar10;
        *(int **)(this_01 + 8) = iVar7._M_current + 1;
      }
      uVar14 = uVar14 + 1;
      ppVar9 = (this->new_edges_).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 4;
      lVar15 = lVar15 + 8;
    } while (uVar14 < (ulong)((long)(this->new_edges_).
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 3))
    ;
  }
  return;
}

Assistant:

void S2Builder::EdgeChainSimplifier::Run() {
  // Determine which vertices can be interior vertices of an edge chain.
  for (VertexId v = 0; v < g_.num_vertices(); ++v) {
    is_interior_[v] = IsInterior(v);
  }
  // Attempt to simplify all edge chains that start from a non-interior
  // vertex.  (This takes care of all chains except loops.)
  for (EdgeId e = 0; e < g_.num_edges(); ++e) {
    if (used_[e]) continue;
    Edge edge = g_.edge(e);
    if (is_interior_[edge.first]) continue;
    if (!is_interior_[edge.second]) {
      OutputEdge(e);  // An edge between two non-interior vertices.
    } else {
      SimplifyChain(edge.first, edge.second);
    }
  }
  // If there are any edges left, they form one or more disjoint loops where
  // all vertices are interior vertices.
  //
  // TODO(ericv): It would be better to start from the edge with the smallest
  // min_input_edge_id(), since that would make the output more predictable
  // for testing purposes.  It also means that we won't create an edge that
  // spans the start and end of a polyline if the polyline is snapped into a
  // loop.  (Unfortunately there are pathological examples that prevent us
  // from guaranteeing this in general, e.g. there could be two polylines in
  // different layers that snap to the same loop but start at different
  // positions.  In general we only consider input edge ids to be a hint
  // towards the preferred output ordering.)
  for (EdgeId e = 0; e < g_.num_edges(); ++e) {
    if (used_[e]) continue;
    Edge edge = g_.edge(e);
    if (edge.first == edge.second) {
      // Note that it is safe to output degenerate edges as we go along,
      // because this vertex has at least one non-degenerate outgoing edge and
      // therefore we will (or just did) start an edge chain here.
      OutputEdge(e);
    } else {
      SimplifyChain(edge.first, edge.second);
    }
  }

  // Finally, copy the output edges into the appropriate layers.  They don't
  // need to be sorted because the input edges were also unsorted.
  for (int e = 0; e < new_edges_.size(); ++e) {
    int layer = new_edge_layers_[e];
    (*layer_edges_)[layer].push_back(new_edges_[e]);
    (*layer_input_edge_ids_)[layer].push_back(new_input_edge_ids_[e]);
  }
}